

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

bool __thiscall BinGE<0,_1,_0>::propagate(BinGE<0,_1,_0> *this)

{
  IntVar *pIVar1;
  IntVar *pIVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  int64_t m_v;
  long lVar7;
  TrailElem local_30;
  
  pIVar1 = (this->x).var;
  pIVar2 = (this->y).var;
  iVar4 = (pIVar1->max).v;
  lVar7 = -(long)(pIVar2->max).v;
  if ((pIVar1->min).v < (int)lVar7) {
    if (so.lazy) {
      iVar3 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[9])();
      lVar5 = (long)iVar3 * 4 + 2;
    }
    else {
      lVar5 = 0;
    }
    pIVar1 = (this->x).var;
    iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,lVar7,lVar5);
    if ((char)iVar3 != '\0') goto LAB_001b5dc7;
LAB_001b5e5c:
    bVar6 = false;
  }
  else {
LAB_001b5dc7:
    iVar3 = (((this->y).var)->min).v;
    if (SBORROW4(iVar4,-iVar3) != iVar4 + iVar3 < 0) {
      if (so.lazy == true) {
        iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
        lVar7 = (long)iVar3 * 4 + 2;
      }
      else {
        lVar7 = 0;
      }
      pIVar1 = (this->y).var;
      iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])
                        (pIVar1,-(long)iVar4,lVar7,1);
      if ((char)iVar4 == '\0') goto LAB_001b5e5c;
    }
    iVar4 = (((this->y).var)->min).v;
    bVar6 = true;
    iVar3 = (((this->x).var)->min).v;
    if (SBORROW4(iVar3,-iVar4) == iVar3 + iVar4 < 0) {
      local_30.pt = (int *)&(this->super_Propagator).satisfied;
      local_30.x = (int)(this->super_Propagator).satisfied.v;
      local_30.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_30);
      (this->super_Propagator).satisfied.v = '\x01';
    }
  }
  return bVar6;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}